

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O1

bpf_u_int32 if_flags_to_pcap_flags(char *name,u_int if_flags)

{
  return (if_flags >> 3 & 1) + (if_flags & 1) * 2 | if_flags >> 4 & 4;
}

Assistant:

bpf_u_int32
if_flags_to_pcap_flags(const char *name _U_, u_int if_flags)
{
	bpf_u_int32 pcap_flags;

	pcap_flags = 0;
	if (ISLOOPBACK(name, if_flags))
		pcap_flags |= PCAP_IF_LOOPBACK;
	if (ISUP(if_flags))
		pcap_flags |= PCAP_IF_UP;
	if (ISRUNNING(if_flags))
		pcap_flags |= PCAP_IF_RUNNING;
	return (pcap_flags);
}